

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O1

void __thiscall QGraphicsView::invalidateScene(QGraphicsView *this,QRectF *rect,SceneLayers layers)

{
  long lVar1;
  QWidgetData *pQVar2;
  QRect QVar3;
  char cVar4;
  QWidget *pQVar5;
  long in_FS_OFFSET;
  QPolygon local_50;
  undefined1 local_38 [16];
  long local_28;
  
  QVar3._8_8_ = local_38._8_8_;
  QVar3._0_8_ = local_38._0_8_;
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((((uint)layers.super_QFlagsStorageHelper<QGraphicsScene::SceneLayer,_4>.
              super_QFlagsStorage<QGraphicsScene::SceneLayer>.i & 2) != 0) &&
     (lVar1 = *(long *)(this + 8), local_38 = (undefined1  [16])QVar3,
     (*(byte *)(lVar1 + 0x301) & 8) == 0)) {
    local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    mapFromScene(&local_50,this,rect);
    local_38 = QPolygon::boundingRect();
    if (&(local_50.super_QList<QPoint>.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_50.super_QList<QPoint>.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
      _M_i = ((local_50.super_QList<QPoint>.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_50.super_QList<QPoint>.d.d)->super_QArrayData).ref_._q_value.
          super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_50.super_QList<QPoint>.d.d)->super_QArrayData,8,0x10);
      }
    }
    pQVar5 = QAbstractScrollArea::viewport((QAbstractScrollArea *)this);
    pQVar2 = pQVar5->data;
    local_50.super_QList<QPoint>.d.ptr =
         (QPoint *)
         CONCAT44((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i,
                  (pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i);
    local_50.super_QList<QPoint>.d.d = (Data *)0x0;
    cVar4 = QRect::intersects((QRect *)&local_50);
    if (cVar4 != '\0') {
      QRegion::operator+=((QRegion *)(lVar1 + 0x508),(QRect *)local_38);
      if (((*(long *)(lVar1 + 0x490) != 0) && (*(int *)(*(long *)(lVar1 + 0x490) + 4) != 0)) &&
         (*(long *)(lVar1 + 0x498) != 0)) {
        QGraphicsScene::update(*(QGraphicsScene **)(lVar1 + 0x498),rect);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsView::invalidateScene(const QRectF &rect, QGraphicsScene::SceneLayers layers)
{
    Q_D(QGraphicsView);
    if ((layers & QGraphicsScene::BackgroundLayer) && !d->mustResizeBackgroundPixmap) {
        QRect viewRect = mapFromScene(rect).boundingRect();
        if (viewport()->rect().intersects(viewRect)) {
            // The updated background area is exposed; schedule this area for
            // redrawing.
            d->backgroundPixmapExposed += viewRect;
            if (d->scene)
                d->scene->update(rect);
        }
    }
}